

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utAnim.cpp
# Opt level: O0

void __thiscall
utAnim_aiVectorKeyCreationTest_Test::~utAnim_aiVectorKeyCreationTest_Test
          (utAnim_aiVectorKeyCreationTest_Test *this)

{
  utAnim_aiVectorKeyCreationTest_Test *this_local;
  
  ~utAnim_aiVectorKeyCreationTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( utAnim, aiVectorKeyCreationTest ) {
    aiVectorKey defaultConstTest;
    EXPECT_DOUBLE_EQ( 0.0, defaultConstTest.mTime );

    aiVector3D v( 1, 2, 3 );
    aiVectorKey constrWithValuesTest( 1, v );
    EXPECT_DOUBLE_EQ( 1.0, constrWithValuesTest.mTime );
    EXPECT_EQ( v, constrWithValuesTest.mValue );

    EXPECT_NE( defaultConstTest, constrWithValuesTest );
    EXPECT_TRUE( defaultConstTest != constrWithValuesTest );
    defaultConstTest.mTime = 1;
    constrWithValuesTest.mTime = 2;
    EXPECT_TRUE( defaultConstTest < constrWithValuesTest );
}